

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

void sat_solver_set_var_activity(sat_solver *s,int *pVars,int nVars)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = 0;
  uVar4 = (ulong)(uint)s->size;
  if (s->size < 1) {
    uVar4 = uVar1;
  }
  for (; uVar4 != uVar1; uVar1 = uVar1 + 1) {
    s->activity[uVar1] = 0;
  }
  if (s->VarActType == 1) {
    s->var_inc = 0x3ff0000000000000;
    uVar4 = 0;
    uVar1 = 0;
    if (0 < nVars) {
      uVar1 = (ulong)(uint)nVars;
    }
    for (; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      if (pVars == (int *)0x0) {
        iVar2 = (int)uVar4;
      }
      else {
        iVar2 = pVars[uVar4];
      }
      s->activity[iVar2] = (word)(double)nVars;
      if (s->orderpos[iVar2] != -1) {
        order_update(s,iVar2);
      }
      nVars = nVars + -1;
    }
  }
  else {
    if (s->VarActType != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0xf5,"void sat_solver_set_var_activity(sat_solver *, int *, int)");
    }
    s->var_inc = 0x20;
    s->var_decay = 0xffffffffffffffff;
    lVar3 = (long)nVars;
    uVar1 = 0;
    uVar4 = (ulong)(uint)nVars;
    if (nVars < 1) {
      uVar4 = uVar1;
    }
    for (; uVar4 != uVar1; uVar1 = uVar1 + 1) {
      if (pVars == (int *)0x0) {
        iVar2 = (int)uVar1;
      }
      else {
        iVar2 = pVars[uVar1];
      }
      s->activity[iVar2] = s->var_inc * lVar3;
      if (s->orderpos[iVar2] != -1) {
        order_update(s,iVar2);
      }
      lVar3 = lVar3 + -1;
    }
  }
  return;
}

Assistant:

void sat_solver_set_var_activity(sat_solver* s, int * pVars, int nVars) 
{
    int i;
    for (i = 0; i < s->size; i++)
        s->activity[i] = 0;
    if ( s->VarActType == 0 )
    {
        s->var_inc            = (1 <<  5);
        s->var_decay          = -1;
        for ( i = 0; i < nVars; i++ )
        {
            int iVar = pVars ? pVars[i] : i;
            s->activity[iVar] = s->var_inc*(nVars-i);
            if (s->orderpos[iVar] != -1)
                order_update( s, iVar );
        }
    }
    else if ( s->VarActType == 1 )
    {
        s->var_inc = Abc_Dbl2Word(1);
        for ( i = 0; i < nVars; i++ )
        {
            int iVar = pVars ? pVars[i] : i;
            s->activity[iVar] = Abc_Dbl2Word(nVars-i);
            if (s->orderpos[iVar] != -1)
                order_update( s, iVar );
        }
    }
    else assert( 0 );
}